

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool VW::is_ring_example(vw *all,example *ae)

{
  bool bVar1;
  
  bVar1 = object_pool<example,_example_initializer>::is_from_pool(&all->p->example_pool,ae);
  return bVar1;
}

Assistant:

bool is_ring_example(vw& all, example* ae) { return all.p->example_pool.is_from_pool(ae); }